

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore_test.cpp
# Opt level: O0

void __thiscall
SemaphoreTest_CtorZero_Test<GenericSemaphore>::TestBody
          (SemaphoreTest_CtorZero_Test<GenericSemaphore> *this)

{
  bool bVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  AssertHelper local_e8;
  Message local_e0 [6];
  exception *e;
  counting_semaphore<1L> local_a8;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  SemaphoreTest_CtorZero_Test<GenericSemaphore> *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::counting_semaphore<1L>::counting_semaphore(&local_a8,0);
      yamc::counting_semaphore<1L>::~counting_semaphore(&local_a8);
    }
  }
  else {
    testing::Message::Message(local_e0);
    std::operator+(&local_108,
                   "Expected: counting_semaphore{0} doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/semaphore_test.cpp"
               ,0x59,message);
    testing::internal::AssertHelper::operator=(&local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    testing::Message::~Message(local_e0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  return;
}

Assistant:

TYPED_TEST(SemaphoreTest, CtorZero)
{
  using counting_semaphore = typename TypeParam::template counting_semaphore<1>;
  EXPECT_NO_THROW(counting_semaphore{0});
}